

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyGlobals.cpp
# Opt level: O2

void __thiscall
wasm::(anonymous_namespace)::GlobalUseScanner::readsGlobalOnlyToWriteIt(wasm::Expression*,wasm::
Expression*)::FlowScanner::visitExpression(wasm::Expression__(void *this,Expression *curr)

{
  Expression *ast;
  Expression *pEVar1;
  int iVar2;
  bool bVar3;
  Expression **ppEVar4;
  undefined8 *puVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  Name NVar9;
  undefined1 local_1b8 [8];
  EffectAnalyzer parentEffects;
  
  if ((curr->_id == GlobalGetId) && (curr[1].type.id == *(uintptr_t *)((long)this + 0x158))) {
    ppEVar4 = SmallVector<wasm::Expression_*,_10UL>::back
                        ((SmallVector<wasm::Expression_*,_10UL> *)((long)this + 0xd8));
    if (*ppEVar4 != curr) {
      __assert_fail("expressionStack.back() == get",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/SimplifyGlobals.cpp"
                    ,0xd9,
                    "void wasm::(anonymous namespace)::GlobalUseScanner::readsGlobalOnlyToWriteIt(Expression *, Expression *)::FlowScanner::visitExpression(Expression *)"
                   );
    }
    iVar2 = (int)((ulong)(*(long *)((long)this + 0x138) - *(long *)((long)this + 0x130)) >> 3);
    parentEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (long)this + 0xe0;
    lVar7 = (ulong)(uint)(iVar2 + -1 + *(int *)((long)this + 0xd8)) * 8 + -0x50;
    for (uVar8 = (iVar2 + *(int *)((long)this + 0xd8)) - 2; -1 < (int)uVar8; uVar8 = uVar8 - 1) {
      puVar5 = (undefined8 *)(*(long *)((long)this + 0x130) + -0x50 + (ulong)uVar8 * 8);
      if (uVar8 < 10) {
        puVar5 = (undefined8 *)
                 (parentEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count +
                 (ulong)uVar8 * 8);
      }
      lVar6 = *(long *)((long)this + 0x130);
      if (uVar8 < 9) {
        lVar6 = (long)this + 0x130;
      }
      ast = (Expression *)*puVar5;
      pEVar1 = *(Expression **)(lVar6 + lVar7);
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)local_1b8,*(PassOptions **)((long)this + 0x160),
                 *(Module **)((long)this + 0x168));
      EffectAnalyzer::visit((EffectAnalyzer *)local_1b8,ast);
      bVar3 = EffectAnalyzer::hasUnremovableSideEffects((EffectAnalyzer *)local_1b8);
      if (bVar3) {
LAB_0098d66f:
        *(undefined1 *)((long)this + 0x170) = 0;
LAB_0098d67a:
        EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_1b8);
        return;
      }
      if ((ast->_id == IfId) && (*(Expression **)(ast + 1) == pEVar1)) {
        if ((*(long *)(ast + 2) == 0) &&
           (NVar9 = anon_unknown_224::GlobalUseScanner::readsGlobalOnlyToWriteIt
                              (*(GlobalUseScanner **)((long)this + 0x148),*(Expression **)(ast + 1),
                               (Expression *)ast[1].type.id),
           NVar9.super_IString.str._M_str == *(char **)((long)this + 0x158))) goto LAB_0098d67a;
        goto LAB_0098d66f;
      }
      EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_1b8);
      lVar7 = lVar7 + -8;
    }
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
        if (auto* get = curr->dynCast<GlobalGet>()) {
          if (get->name == writtenGlobal) {
            // We found the get of the global. Check where its value flows to,
            // and how it is used there.
            assert(expressionStack.back() == get);
            for (int i = int(expressionStack.size()) - 2; i >= 0; i--) {
              // Consider one pair of parent->child, and check if the parent
              // causes any problems when the child's value reaches it.
              auto* parent = expressionStack[i];
              auto* child = expressionStack[i + 1];
              EffectAnalyzer parentEffects(passOptions, wasm);
              parentEffects.visit(parent);
              if (parentEffects.hasUnremovableSideEffects()) {
                // The parent has some side effect, and the child's value may
                // be used to determine its manner, so this is dangerous.
                ok = false;
                break;
              }

              if (auto* iff = parent->dynCast<If>()) {
                if (iff->condition == child) {
                  // The child is used to decide what code to run, which is
                  // dangerous: check what effects it causes. If it is a nested
                  // appearance of the pattern, that is one case that we know is
                  // actually safe.
                  if (!iff->ifFalse &&
                      globalUseScanner.readsGlobalOnlyToWriteIt(
                        iff->condition, iff->ifTrue) == writtenGlobal) {
                    // This is safe, and we can stop here: the value does not
                    // flow any further.
                    break;
                  }

                  // Otherwise, we found a problem, and can stop.
                  ok = false;
                  break;
                }
              }
            }
          }
        }
      }